

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O0

void do_memtest(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *qch;
  char buf [4608];
  char *in_stack_ffffffffffffed68;
  char *in_stack_ffffffffffffed70;
  allocator<char> local_1279;
  string local_1278 [24];
  allocator<char> *in_stack_ffffffffffffeda0;
  char *in_stack_ffffffffffffeda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedb0;
  allocator<char> local_1241;
  string local_1240 [264];
  char_data **in_stack_ffffffffffffeec8;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffeed0;
  string *in_stack_ffffffffffffeed8;
  string *in_stack_ffffffffffffeee0;
  int in_stack_ffffffffffffeeec;
  CQueue *in_stack_ffffffffffffeef0;
  char (*in_stack_ffffffffffffef00) [10];
  
  one_argument(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
  CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[10]>
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee0,
             in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             in_stack_ffffffffffffef00);
  std::__cxx11::string::~string(local_1278);
  std::allocator<char>::~allocator(&local_1279);
  std::__cxx11::string::~string(local_1240);
  std::allocator<char>::~allocator(&local_1241);
  return;
}

Assistant:

void do_memtest(CHAR_DATA *ch, char *argument)
{
	char buf[MSL];
	CHAR_DATA *qch;
	argument = one_argument(argument, buf);
	RS.Queue.AddToQueue(6, "do_memtest", "do_bash_queue", do_bash_queue, ch, "Calenduil");
	return;

	//TODO: what the what???

	if(buf[0]=='\0' || !argument || !is_number(argument))
		return;
	if(number_percent()> (.2 * get_skill(ch,gsn_rage)))
	{
		sprintf(buf,"%f is the value.\n\r",.2 * get_skill(ch,gsn_rage));
		send_to_char(buf,ch);
	}
	return;
	if(!str_cmp(buf,"dammod"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001)
				qch->dam_mod = atoi(argument);
		send_to_char("Dammod changed.\n\r",ch);
	}
	if(!str_cmp(buf,"hp"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001)
				qch->max_hit = std::max(qch->max_hit - atoi(argument), 100);
		send_to_char("Maxhit changed.\n\r",ch);
	}
	if(!str_cmp(buf,"begin"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001 && !is_affected_by(qch, AFF_DETECT_MAGIC))
				SET_BIT(qch->affected_by, AFF_DETECT_MAGIC);
		send_to_char("It HAS BEGUN!\n\r",ch);
	}
	if(!str_cmp(buf,"end"))
	{
		for(qch = char_list; qch; qch = qch->next)
			if(is_npc(qch) && qch->pIndexData->vnum == 3001 && qch->in_room->vnum > 2399 &&
			   qch->in_room->vnum < 2801)
				extract_char(qch, true);
		send_to_char("It has.. ENDED!\n\r",ch);
	}
}